

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeLogger.h
# Opt level: O1

void __thiscall
TimeLogger<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::~TimeLogger
          (TimeLogger<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *this)

{
  ostream *poVar1;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  std::chrono::_V2::system_clock::now();
  poVar1 = this->stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Date: ",6);
  get_date_abi_cxx11_();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_38,local_30);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Elapsed time: ",0xe);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return;
}

Assistant:

~TimeLogger() {

        auto end = std::chrono::system_clock::now();
        stream << "Date: " << get_date() << std::endl
               << "Elapsed time: " << ch::duration_cast<T>(end - start).count() << std::endl;
    }